

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

art_ref_t art_move_node_to_shrink(art_t *art,art_ref_t ref)

{
  long lVar1;
  size_t __n;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  art_ref_t ref_00;
  ulong uVar8;
  bool bVar9;
  
  uVar7 = ref >> 0x10;
  uVar8 = ref & 0xff;
  uVar4 = art->first_free[uVar8];
  ref_00 = ref;
  if (uVar4 <= uVar7) {
    ref_00 = uVar4 << 0x10 | uVar8;
    uVar2 = art_node_get_next_free(art,ref_00);
    uVar3 = (ulong)(uint)((int)uVar8 * 8);
    lVar1 = *(long *)((long)art->nodes + uVar3);
    __n = *(size_t *)((long)ART_NODE_SIZES + uVar3);
    memcpy((void *)(uVar4 * __n + lVar1),(void *)(lVar1 + __n * uVar7),__n);
    uVar5 = uVar2;
    uVar6 = uVar2;
    while (uVar4 = uVar5, uVar4 < uVar7) {
      uVar5 = art_node_get_next_free(art,uVar4 << 0x10 | uVar8);
      uVar6 = uVar4;
    }
    bVar9 = 0xfa < (byte)((char)ref - 6U);
    if (((bVar9) && (*(ulong *)((long)art->nodes[uVar8] + __n * uVar7) = uVar4, bVar9)) &&
       (uVar6 < uVar7)) {
      *(ulong *)((long)art->nodes[uVar8] + (uVar6 & 0xffffffffffff) * __n) = uVar7;
    }
    if (uVar7 < uVar2) {
      uVar2 = uVar7;
    }
    art->first_free[uVar8] = uVar2;
  }
  return ref_00;
}

Assistant:

static art_ref_t art_move_node_to_shrink(art_t *art, art_ref_t ref) {
    uint64_t idx = art_ref_index(ref);
    art_typecode_t typecode = art_ref_typecode(ref);
    uint64_t first_free = art->first_free[typecode];
    assert(idx != first_free);
    if (idx < first_free) {
        return ref;
    }
    uint64_t from = idx;
    uint64_t to = first_free;
    uint64_t next_free = art_node_get_next_free(art, art_to_ref(to, typecode));
    memcpy(art_get_node(art, to, typecode), art_get_node(art, from, typecode),
           ART_NODE_SIZES[typecode]);

    // With an integer representing the next free index, and an `x` representing
    // an occupied index, assume the following scenario at the start of this
    // function:
    //     nodes = [1,2,5,x,x]
    //     first_free = 0
    //
    // We just moved a node from index 3 to 0:
    //     nodes = [x,2,5,?,x]
    //
    // We need to modify the free list so that the free indices are ascending.
    // This can be done by traversing the list until we find a node with a
    // `next_free` greater than the index we copied the node from, and inserting
    // the new index in between. This leads to the following:
    //     nodes = [x,2,3,5,x]
    //     first_free = 1
    uint64_t initial_next_free = next_free;
    uint64_t current = next_free;
    while (next_free < from) {
        current = next_free;
        next_free =
            art_node_get_next_free(art, art_to_ref(next_free, typecode));
    }
    art_node_set_next_free(art_deref(art, ref), typecode, next_free);
    if (current < from) {
        art_node_set_next_free(art_get_node(art, current, typecode), typecode,
                               from);
    }
    art->first_free[typecode] =
        from < initial_next_free ? from : initial_next_free;
    return art_to_ref(to, typecode);
}